

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O2

int __thiscall
NaPNStatistics::verify
          (NaPNStatistics *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  NaPetriCnInput *this_00;
  uint uVar1;
  uint uVar2;
  NaVector *pNVar3;
  
  uVar1 = NaVector::dim(&this->Mean);
  this_00 = &this->signal;
  pNVar3 = NaPetriCnInput::data(this_00);
  uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
  if (uVar1 == uVar2) {
    uVar1 = NaVector::dim(&this->StdDev);
    pNVar3 = NaPetriCnInput::data(this_00);
    uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
    if (uVar1 == uVar2) {
      uVar1 = NaVector::dim(&this->RMS);
      pNVar3 = NaPetriCnInput::data(this_00);
      uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
      if (uVar1 == uVar2) {
        uVar1 = NaVector::dim(&this->Min);
        pNVar3 = NaPetriCnInput::data(this_00);
        uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
        if (uVar1 == uVar2) {
          uVar1 = NaVector::dim(&this->Max);
          pNVar3 = NaPetriCnInput::data(this_00);
          uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
          if (uVar1 == uVar2) {
            uVar1 = NaVector::dim(&this->Sum);
            pNVar3 = NaPetriCnInput::data(this_00);
            uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
            if (uVar1 == uVar2) {
              uVar1 = NaVector::dim(&this->Sum2);
              pNVar3 = NaPetriCnInput::data(this_00);
              uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
              return CONCAT31((int3)(uVar2 >> 8),uVar1 == uVar2);
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

bool
NaPNStatistics::verify ()
{
    return Mean.dim() == signal.data().dim()
        && StdDev.dim() == signal.data().dim()
        && RMS.dim() == signal.data().dim()
        && Min.dim() == signal.data().dim()
        && Max.dim() == signal.data().dim()
        && Sum.dim() == signal.data().dim()
        && Sum2.dim() == signal.data().dim();
}